

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O1

void yang_print_must(lyout *out,int level,lys_module *module,lys_restr *must)

{
  char *value;
  
  value = transform_json2schema(module,must->expr);
  if (value != (char *)0x0) {
    yang_print_restr(out,level,module,must,"must",value);
    lydict_remove(module->ctx,value);
    return;
  }
  ly_print(out,"(!error!)");
  return;
}

Assistant:

static void
yang_print_must(struct lyout *out, int level, const struct lys_module *module, const struct lys_restr *must)
{
    const char *str;

    str = transform_json2schema(module, must->expr);
    if (!str) {
        ly_print(out, "(!error!)");
        return;
    }
    yang_print_restr(out, level, module, must, "must", str);
    lydict_remove(module->ctx, str);
}